

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O3

int file_write_ul(png_t *png,uint in)

{
  uint in_EDX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  uchar buf [4];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX >> 0x18 | (in_EDX & 0xff0000) >> 8 | (in_EDX & 0xff00) << 8 | in_EDX << 0x18;
  if (png == (png_t *)0x0) {
    fwrite(&local_c,1,4,(FILE *)CONCAT44(in_register_00000034,in));
  }
  else {
    (*(code *)png)(&local_c,1,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static int file_write_ul(png_t* png, unsigned in)
{
	unsigned char buf[4];

	buf[0] = (in>>24u) & 0xffu;
	buf[1] = (in>>16u) & 0xffu;
	buf[2] = (in>>8u) & 0xffu;
	buf[3] = (in) & 0xffu;

	if(file_write(png, buf, 1, 4) != 4)
		return PNG_FILE_ERROR;

	return PNG_NO_ERROR;
}